

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrandom.cpp
# Opt level: O1

void __thiscall
QRandomGenerator::SystemGenerator::generate(SystemGenerator *this,quint32 *begin,quint32 *end)

{
  long lVar1;
  long lVar2;
  
  lVar2 = (long)end - (long)begin >> 2;
  if (((uint)qt_cpu_features[0].super___atomic_base<unsigned_long>._M_i >> 0xb & 1) == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = qRandomCpu(begin,lVar2);
  }
  lVar2 = lVar2 - lVar1;
  if (lVar2 == 0) {
    return;
  }
  fillBuffer(begin + lVar1,lVar2 * 4);
  return;
}

Assistant:

QRandomGenerator::SystemGenerator::generate(quint32 *begin, quint32 *end)
    noexcept(FillBufferNoexcept)
{
    quint32 *buffer = begin;
    qsizetype count = end - begin;

    if (Q_UNLIKELY(uint(qt_randomdevice_control.loadAcquire()) & SetRandomData)) {
        uint value = uint(qt_randomdevice_control.loadAcquire()) & RandomDataMask;
        std::fill_n(buffer, count, value);
        return;
    }

    qsizetype filled = 0;
    if (qHasHwrng() && (uint(qt_randomdevice_control.loadAcquire()) & SkipHWRNG) == 0)
        filled += qRandomCpu(buffer, count);

    if (filled != count && (uint(qt_randomdevice_control.loadAcquire()) & SkipSystemRNG) == 0) {
        qsizetype bytesFilled =
                fillBuffer(buffer + filled, (count - filled) * qsizetype(sizeof(*buffer)));
        filled += bytesFilled / qsizetype(sizeof(*buffer));
    }
    if (filled)
        fallback_update_seed(*buffer);

    if (Q_UNLIKELY(filled != count)) {
        // failed to fill the entire buffer, try the faillback mechanism
        fallback_fill(buffer + filled, count - filled);
    }
}